

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Bac_Man_t * Bac_PtrTransformToCba(Vec_Ptr_t *vDes)

{
  int i_00;
  int nCapMin;
  int iVar1;
  int iVar2;
  char *pcVar3;
  Bac_Man_t *pBVar4;
  char *pcVar5;
  size_t sVar6;
  Abc_Nam_t *pAVar7;
  Bac_Ntk_t *pBVar8;
  Vec_Ptr_t *pVVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  char **pNames;
  int *__s;
  ulong uVar15;
  int i;
  long lVar16;
  int local_5c;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Bac_Man_t *local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  uVar15 = 0;
  pcVar3 = (char *)Vec_PtrEntry(vDes,0);
  iVar1 = vDes->nSize;
  uVar13 = iVar1 - 1;
  lVar14 = 1;
  local_40 = vDes;
  pBVar4 = (Bac_Man_t *)calloc(1,0x530);
  pcVar5 = Extra_FileDesignName(pcVar3);
  pBVar4->pName = pcVar5;
  local_48 = pBVar4;
  if (pcVar3 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar5 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar5,pcVar3);
  }
  pBVar4 = local_48;
  local_48->pSpec = pcVar5;
  pAVar7 = Abc_NamStart(1000,0x18);
  pBVar4->pStrs = pAVar7;
  pAVar7 = Abc_NamStart(1000,0x18);
  pBVar4->pMods = pAVar7;
  pBVar4->iRoot = 1;
  pBVar4->nNtks = uVar13;
  pBVar8 = (Bac_Ntk_t *)calloc((long)iVar1,0xd0);
  pBVar4->pNtks = pBVar8;
  uVar12 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    uVar12 = uVar15;
  }
  for (; uVar12 * 0xd0 - uVar15 != 0; uVar15 = uVar15 + 0xd0) {
    *(Bac_Man_t **)((long)&pBVar8[1].pDesign + uVar15) = pBVar4;
  }
  pNames = pBVar4->pPrimNames;
  Bac_ManSetupTypes(pNames,pBVar4->pPrimSymbs);
  local_50 = Vec_IntAlloc((int)pNames);
  local_50->nSize = 1000;
  __s = local_50->pArray;
  if (__s != (int *)0x0) {
    memset(__s,0xff,4000);
  }
  local_58 = Vec_IntAlloc((int)__s);
  while (uVar15 = (ulong)pBVar4->nNtks, lVar14 <= (long)uVar15) {
    pBVar8 = pBVar4->pNtks;
    local_38 = lVar14;
    pVVar9 = (Vec_Ptr_t *)Vec_PtrEntry(local_40,(int)lVar14);
    pvVar10 = Vec_PtrEntry(pVVar9,1);
    pvVar11 = Vec_PtrEntry(pVVar9,2);
    pAVar7 = pBVar4->pStrs;
    pcVar3 = (char *)Vec_PtrEntry(pVVar9,0);
    i_00 = Abc_NamStrFindOrAdd(pAVar7,pcVar3,(int *)0x0);
    iVar1 = *(int *)((long)pvVar10 + 4);
    iVar2 = *(int *)((long)pvVar11 + 4);
    nCapMin = Ptr_ManCountNtk(pVVar9);
    if (pBVar8[lVar14].pDesign == (Bac_Man_t *)0x0) {
      __assert_fail("pNew->pDesign != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    pBVar8 = pBVar8 + lVar14;
    if ((pBVar8->vInputs).nSize != 0) {
      __assert_fail("Bac_NtkPiNum(pNew) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    if ((pBVar8->vOutputs).nSize != 0) {
      __assert_fail("Bac_NtkPoNum(pNew) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    pBVar8->NameId = i_00;
    pBVar8->iCopy = -1;
    pBVar8->iBoxNtk = -1;
    pBVar8->iBoxObj = -1;
    Vec_IntGrow(&pBVar8->vInputs,iVar1);
    Vec_IntGrow(&pBVar8->vOutputs,iVar2);
    Vec_StrGrow(&pBVar8->vType,nCapMin);
    Vec_IntGrow(&pBVar8->vFanin,nCapMin);
    pAVar7 = pBVar8->pDesign->pMods;
    pcVar3 = Bac_NtkStr(pBVar8,i_00);
    iVar1 = Abc_NamStrFindOrAdd(pAVar7,pcVar3,&local_5c);
    if (local_5c == 0) {
      iVar2 = Bac_NtkId(pBVar8);
      if (iVar1 != iVar2) {
        __assert_fail("NtkId == Bac_NtkId(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
    }
    else {
      pcVar3 = Bac_NtkStr(pBVar8,i_00);
      printf("Network with name %s already exists.\n",pcVar3);
    }
    uVar13 = (pBVar8->vType).nCap;
    if (uVar13 == 0) {
      __assert_fail("Bac_NtkObjNumAlloc(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
    }
    Vec_IntGrow(&pBVar8->vName,uVar13);
    uVar15 = 0;
    if (0 < (int)uVar13) {
      uVar15 = (ulong)uVar13;
    }
    for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
      (pBVar8->vName).pArray[uVar12] = 0;
    }
    (pBVar8->vName).nSize = uVar13;
    pBVar4 = local_48;
    lVar14 = local_38 + 1;
  }
  lVar14 = 1;
  lVar16 = 0xd0;
  do {
    iVar1 = (int)lVar14;
    if ((int)uVar15 < lVar14) break;
    pBVar8 = pBVar4->pNtks;
    pVVar9 = (Vec_Ptr_t *)Vec_PtrEntry(local_40,iVar1);
    iVar2 = Bac_NtkDeriveFromPtr
                      ((Bac_Ntk_t *)((long)&pBVar8->pDesign + lVar16),pVVar9,local_50,local_58);
    lVar14 = lVar14 + 1;
    lVar16 = lVar16 + 0xd0;
    uVar15 = (ulong)(uint)pBVar4->nNtks;
  } while (iVar2 != 0);
  if (iVar1 <= (int)uVar15) {
    lVar16 = 400;
    for (lVar14 = 1; lVar14 <= (int)uVar15; lVar14 = lVar14 + 1) {
      pBVar8 = pBVar4->pNtks;
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0xa0));
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0x90));
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0x80));
      pvVar10 = *(void **)((long)pBVar8 + lVar16 + -0x68);
      if (pvVar10 != (void *)0x0) {
        free(pvVar10);
        *(undefined8 *)((long)pBVar8 + lVar16 + -0x68) = 0;
      }
      *(undefined8 *)((long)pBVar8 + lVar16 + -0x70) = 0;
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0x60));
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0x50));
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0x40));
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0x30));
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0x20));
      Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar16 + -0x10));
      Vec_IntErase((Vec_Int_t *)((long)&pBVar8->pDesign + lVar16));
      uVar15 = (ulong)(uint)pBVar4->nNtks;
      lVar16 = lVar16 + 0xd0;
    }
    Vec_IntErase(&pBVar4->vBuf2LeafNtk);
    Vec_IntErase(&pBVar4->vBuf2LeafObj);
    Vec_IntErase(&pBVar4->vBuf2RootNtk);
    Vec_IntErase(&pBVar4->vBuf2RootObj);
    Abc_NamDeref(pBVar4->pStrs);
    Abc_NamDeref(pBVar4->pMods);
    if (pBVar4->pName != (char *)0x0) {
      free(pBVar4->pName);
      pBVar4->pName = (char *)0x0;
    }
    if (pBVar4->pSpec != (char *)0x0) {
      free(pBVar4->pSpec);
      pBVar4->pSpec = (char *)0x0;
    }
    free(pBVar4->pNtks);
    free(pBVar4);
    pBVar4 = (Bac_Man_t *)0x0;
  }
  Vec_IntFree(local_58);
  Vec_IntFree(local_50);
  return pBVar4;
}

Assistant:

Bac_Man_t * Bac_PtrTransformToCba( Vec_Ptr_t * vDes )
{
    char * pName = (char *)Vec_PtrEntry(vDes, 0);
    Bac_Man_t * pNew = Bac_ManAlloc( pName, Vec_PtrSize(vDes) - 1 );
    Vec_Int_t * vMap = Vec_IntStartFull( 1000 );
    Vec_Int_t * vBox2Id = Vec_IntAlloc( 1000 );
    // create interfaces
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( pNew, pNtk, i )
    {
        Vec_Ptr_t * vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes, i);
        Vec_Ptr_t * vInputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
        Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
        int NameId = Abc_NamStrFindOrAdd( pNew->pStrs, (char *)Vec_PtrEntry(vNtk, 0), NULL );
        Bac_NtkAlloc( pNtk, NameId, Vec_PtrSize(vInputs), Vec_PtrSize(vOutputs), Ptr_ManCountNtk(vNtk) );
        Bac_NtkStartNames( pNtk );
    }
    // parse the networks
    Bac_ManForEachNtk( pNew, pNtk, i )
    {
        Vec_Ptr_t * vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes, i);
        if ( !Bac_NtkDeriveFromPtr( pNtk, vNtk, vMap, vBox2Id ) )
            break;
    }
    if ( i <= Bac_ManNtkNum(pNew) )
       Bac_ManFree(pNew), pNew = NULL;
    Vec_IntFree( vBox2Id );
    Vec_IntFree( vMap );
    return pNew;
}